

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notifier.hpp
# Opt level: O0

void __thiscall tf::Notifier::notify_n(Notifier *this,size_t n)

{
  size_type sVar1;
  ulong local_20;
  size_t k;
  size_t n_local;
  Notifier *this_local;
  
  sVar1 = std::vector<tf::Notifier::Waiter,_std::allocator<tf::Notifier::Waiter>_>::size
                    (&this->_waiters);
  if (n < sVar1) {
    for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
      notify(this,false);
    }
  }
  else {
    notify(this,true);
  }
  return;
}

Assistant:

void notify_n(size_t n) {
    if(n >= _waiters.size()) {
      notify(true);
    }
    else {
      for(size_t k=0; k<n; ++k) {
        notify(false);
      }
    }
  }